

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O0

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,Player *player)

{
  int *piVar1;
  string *__return_storage_ptr__;
  PlayerStrategy *this_00;
  Player *player_local;
  PlayerStrategy *this_local;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_00169808;
  piVar1 = (int *)operator_new(4);
  *piVar1 = -1;
  this->numWeakest = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->exchangingCardType = piVar1;
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->armiesToPlace = piVar1;
  this->player = player;
  this->from = (Country *)0x0;
  this->to = (Country *)0x0;
  __return_storage_ptr__ = (string *)operator_new(0x20);
  this_00 = Player::getStrategy(player);
  getStrategyName_abi_cxx11_(__return_storage_ptr__,this_00);
  this->strategyName = __return_storage_ptr__;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(Player* player) {
    this->exchangingCardType = new int(0);
    this->armiesToPlace = new int(0);
    this->player = player;
    this->from = nullptr;
    this->to = nullptr;
    this->strategyName = new std::string(player->getStrategy()->getStrategyName());
}